

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O2

int __thiscall XInputSimulatorImplLinux::charToKeyCode(XInputSimulatorImplLinux *this,char key_char)

{
  byte bVar1;
  ostream *poVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"cchar: ");
  iVar3 = (int)CONCAT71(in_register_00000031,key_char);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = XKeysymToKeycode(this->display,(long)iVar3);
  poVar2 = std::operator<<((ostream *)&std::cout,"ccode: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)bVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return (uint)bVar1;
}

Assistant:

int XInputSimulatorImplLinux::charToKeyCode(char key_char)
{
    std::cout << "cchar: " << (int)key_char << std::endl;

    int keyCode = XKeysymToKeycode(display, key_char);
//    int keyCode = XKeysymToKeycode(display, XStringToKeysym(&key_char));
    std::cout << "ccode: " << keyCode << std::endl;

    return keyCode;
}